

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayImpDirWrapper.cpp
# Opt level: O0

bool __thiscall DelayImpEntryWrapper::loadNextEntry(DelayImpEntryWrapper *this,size_t entryNum)

{
  ExeNodeWrapper *pEVar1;
  int iVar2;
  DelayImpFuncWrapper *this_00;
  undefined4 extraout_var;
  long *local_80;
  DelayImpDirWrapper *impDir;
  uint64_t local_40;
  uint64_t thunk;
  bool isOk;
  DelayImpFuncWrapper *local_28;
  DelayImpFuncWrapper *entry;
  size_t entryNum_local;
  DelayImpEntryWrapper *this_local;
  
  entry = (DelayImpFuncWrapper *)entryNum;
  entryNum_local = (size_t)this;
  this_00 = (DelayImpFuncWrapper *)operator_new(0x50);
  DelayImpFuncWrapper::DelayImpFuncWrapper
            (this_00,(this->super_ImportBaseEntryWrapper).super_PENodeWrapper.m_PE,this,
             (size_t)entry);
  local_28 = this_00;
  iVar2 = (*(this_00->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    if (local_28 != (DelayImpFuncWrapper *)0x0) {
      (*(local_28->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
        super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[1])();
    }
    this_local._7_1_ = false;
  }
  else {
    thunk._3_1_ = 0;
    local_40 = ExeElementWrapper::getNumValue
                         ((ExeElementWrapper *)local_28,0,(bool *)((long)&thunk + 3));
    if ((((thunk._3_1_ & 1) == 0) || (local_40 == 0xffffffffffffffff)) || (local_40 == 0)) {
      if (local_28 != (DelayImpFuncWrapper *)0x0) {
        (*(local_28->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
          super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[1])();
      }
      this_local._7_1_ = false;
    }
    else {
      impDir = (DelayImpDirWrapper *)local_28;
      std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>::push_back
                (&(this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                  entries,(value_type *)&impDir);
      pEVar1 = (this->super_ImportBaseEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
               parentNode;
      if (pEVar1 == (ExeNodeWrapper *)0x0) {
        local_80 = (long *)0x0;
      }
      else {
        local_80 = (long *)__dynamic_cast(pEVar1,&ExeNodeWrapper::typeinfo,
                                          &DelayImpDirWrapper::typeinfo,0);
      }
      if (local_80 != (long *)0x0) {
        (**(code **)(*local_80 + 0x168))(local_80,local_28);
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DelayImpEntryWrapper::loadNextEntry(size_t entryNum)
 {
    DelayImpFuncWrapper* entry = new DelayImpFuncWrapper(this->m_PE, this, entryNum);
    if (entry->getPtr() == NULL) {
        delete entry;
        return false;
    }
    bool isOk = false;
    uint64_t thunk = entry->getNumValue(DelayImpFuncWrapper::NAMETHUNK_ADDR, &isOk);
    if (!isOk || thunk == INVALID_ADDR || thunk == 0) {
        delete entry;
        return false;
    }
    this->entries.push_back(entry);

    DelayImpDirWrapper *impDir = dynamic_cast<DelayImpDirWrapper*>(this->parentNode);
    if (impDir) impDir->addMapping(entry);
    return true;
 }